

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

void telnet_free(Backend *be)

{
  _Bool _Var1;
  
  _Var1 = is_tempseat((Seat *)be[-9].vt);
  if (_Var1) {
    tempseat_free((Seat *)be[-9].vt);
  }
  strbuf_free((strbuf *)be[-3].interactor);
  if (be[-10].vt != (BackendVtable *)0x0) {
    (**(code **)((be[-10].vt)->init + 8))();
  }
  if (be[-1].vt != (BackendVtable *)0x0) {
    pinger_free((Pinger *)be[-1].vt);
  }
  conf_free((Conf *)be[-2].interactor);
  safefree(be[-7].vt);
  safefree(be + -10);
  return;
}

Assistant:

static void telnet_free(Backend *be)
{
    Telnet *telnet = container_of(be, Telnet, backend);

    if (is_tempseat(telnet->seat))
        tempseat_free(telnet->seat);
    strbuf_free(telnet->sb_buf);
    if (telnet->s)
        sk_close(telnet->s);
    if (telnet->pinger)
        pinger_free(telnet->pinger);
    conf_free(telnet->conf);
    sfree(telnet->description);
    sfree(telnet);
}